

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFileTests.cc
# Opt level: O2

void __thiscall DataFileTest::testZip(DataFileTest *this)

{
  uint uVar1;
  ssize_t sVar2;
  size_t __nbytes;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *pvVar3;
  void *extraout_RDX_02;
  DataFileReader<Complex<long>_> *this_00;
  unit_test_log_t *this_01;
  ulong uVar4;
  size_t i;
  test_observer tVar5;
  ulong local_110;
  DataFileWriter<Complex<long>_> writer;
  DataFileReader<Complex<long>_> reader;
  unit_test_log_t local_e0;
  ulong local_d8;
  undefined8 *local_d0;
  char *local_c8;
  ValidSchema dschema;
  size_t number_of_objects;
  char *local_a8;
  char *local_a0;
  const_string local_98;
  const_string local_88;
  ComplexInteger record;
  char *local_60;
  char *local_58;
  const_string local_50;
  const_string local_40;
  
  number_of_objects = 100;
  avro::compileJsonSchemaFromString((char *)&dschema);
  __nbytes = 0x4000;
  avro::DataFileWriter<Complex<long>_>::DataFileWriter
            (&writer,this->filename,&dschema,0x4000,DEFLATE_CODEC);
  uVar4 = 0;
  pvVar3 = extraout_RDX;
  for (tVar5._vptr_test_observer = (_func_int **)0x0;
      tVar5._vptr_test_observer != (_func_int **)0x64;
      tVar5._vptr_test_observer = tVar5._vptr_test_observer + 1) {
    local_e0.super_test_observer._vptr_test_observer =
         (test_observer)(test_observer)tVar5._vptr_test_observer;
    local_d8 = uVar4;
    avro::DataFileWriter<Complex<long>_>::write(&writer,(int)&local_e0,pvVar3,__nbytes);
    uVar4 = uVar4 + 2;
    pvVar3 = extraout_RDX_00;
  }
  std::auto_ptr<avro::DataFileWriterBase>::~auto_ptr(&writer.base_);
  avro::DataFileReader<Complex<long>_>::DataFileReader(&reader,this->filename,&dschema);
  writer.base_._M_ptr = (auto_ptr<avro::DataFileWriterBase>)(DataFileWriterBase *)0x0;
  record.re = 0;
  record.im = 0;
  pvVar3 = extraout_RDX_01;
  while( true ) {
    this_00 = &reader;
    sVar2 = avro::DataFileReader<Complex<long>_>::read(&reader,(int)&record,pvVar3,__nbytes);
    if ((char)sVar2 == '\0') break;
    local_e0.super_test_observer._vptr_test_observer._0_4_ = (undefined4)record.re;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              ((vector<int,_std::allocator<int>_> *)&writer,(int *)&local_e0);
    pvVar3 = extraout_RDX_02;
  }
  local_40.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
  ;
  local_40.m_end = "";
  local_50.m_begin = "";
  local_50.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this_00,&local_40,0x1ae,&local_50);
  this_01 = &local_e0;
  local_d8 = local_d8 & 0xffffffffffffff00;
  local_e0.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_001d0ff0;
  local_d0 = &boost::unit_test::lazy_ostream::inst;
  local_c8 = "";
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
  ;
  local_58 = "";
  local_110 = -(long)writer.base_._M_ptr >> 2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (this_01,&local_60,0x1ae,1,2,&local_110,"found.size()",&number_of_objects,
             "number_of_objects");
  uVar1 = 0;
  while (local_110 = CONCAT44(local_110._4_4_,uVar1),
        (ulong)uVar1 < (ulong)(-(long)writer.base_._M_ptr >> 2)) {
    local_88.m_begin =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
    ;
    local_88.m_end = "";
    local_98.m_begin = "";
    local_98.m_end = "";
    boost::unit_test::unit_test_log_t::set_checkpoint(this_01,&local_88,0x1b0,&local_98);
    local_d8 = local_d8 & 0xffffffffffffff00;
    local_e0.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_001d0ff0;
    local_d0 = &boost::unit_test::lazy_ostream::inst;
    local_c8 = "";
    local_a8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/DataFileTests.cc"
    ;
    local_a0 = "";
    this_01 = &local_e0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,unsigned_int>
              (this_01,&local_a8,0x1b0,1,2,(local_110 & 0xffffffff) * 4 + (long)writer.base_._M_ptr,
               "found[i]",&local_110,"i");
    uVar1 = (int)local_110 + 1;
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&writer);
  std::auto_ptr<avro::DataFileReaderBase>::~auto_ptr(&reader.base_);
  boost::detail::shared_count::~shared_count(&dschema.root_.pn);
  return;
}

Assistant:

void testZip() {
        const size_t number_of_objects = 100;
        // first create a large file
        ValidSchema dschema = avro::compileJsonSchemaFromString(sch);
        {
            avro::DataFileWriter<ComplexInteger> writer(
              filename, dschema, 16 * 1024, avro::DEFLATE_CODEC);

            for (size_t i = 0; i < number_of_objects; ++i) {
                ComplexInteger d;
                d.re = i;
                d.im = 2 * i;
                writer.write(d);
            }
        }
        {
            avro::DataFileReader<ComplexInteger> reader(filename, dschema);
            std::vector<int> found;
            ComplexInteger record;
            while (reader.read(record)) {
                found.push_back(record.re);
            }
            BOOST_CHECK_EQUAL(found.size(), number_of_objects);
            for (unsigned int i = 0; i < found.size(); ++i) {
                BOOST_CHECK_EQUAL(found[i], i);
            }
        }
    }